

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O1

void __thiscall
HModel::util_getBasicIndexNonbasicFlag
          (HModel *this,vector<int,_std::allocator<int>_> *basicIndex_,
          vector<int,_std::allocator<int>_> *nonbasicFlag_)

{
  pointer piVar1;
  pointer piVar2;
  uint uVar3;
  ulong uVar4;
  
  std::vector<int,_std::allocator<int>_>::resize(basicIndex_,(long)this->numRow);
  std::vector<int,_std::allocator<int>_>::resize
            (nonbasicFlag_,
             (long)(this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  piVar1 = (this->basicIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(this->basicIndex).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  if (0 < (int)uVar3) {
    piVar2 = (basicIndex_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      piVar2[uVar4] = piVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
  }
  piVar1 = (this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = (uint)((ulong)((long)(this->nonbasicFlag).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)piVar1) >> 2);
  if (0 < (int)uVar3) {
    piVar2 = (nonbasicFlag_->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar4 = 0;
    do {
      piVar2[uVar4] = piVar1[uVar4];
      uVar4 = uVar4 + 1;
    } while ((uVar3 & 0x7fffffff) != uVar4);
  }
  return;
}

Assistant:

void HModel::util_getBasicIndexNonbasicFlag(vector<int>& basicIndex_, vector<int>& nonbasicFlag_) {
  basicIndex_.resize(numRow);
  nonbasicFlag_.resize(nonbasicFlag.size());
  int basicIndexSz = basicIndex.size();
  for (int i = 0; i < basicIndexSz; i++) basicIndex_[i] = basicIndex[i];
  int nonbasicFlagSz = nonbasicFlag.size();
  for (int i = 0; i < nonbasicFlagSz; i++) nonbasicFlag_[i] = nonbasicFlag[i];
}